

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv.hpp
# Opt level: O0

void __thiscall
csv::internals::ThreadSafeDeque<csv::CSVRow>::kill_all(ThreadSafeDeque<csv::CSVRow> *this)

{
  undefined1 local_20 [8];
  unique_lock<std::mutex> lock;
  ThreadSafeDeque<csv::CSVRow> *this_local;
  
  lock._8_8_ = this;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_20,&this->_lock);
  this->_is_waitable = false;
  std::condition_variable::notify_all();
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_20);
  return;
}

Assistant:

void kill_all() {
                std::unique_lock<std::mutex> lock{ this->_lock };
                this->_is_waitable = false;
                this->_cond.notify_all();
            }